

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileBacktrace::PrintCallStack(cmListFileBacktrace *this,ostream *out)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  ostream *os;
  Snapshot *this_00;
  Snapshot parent;
  cmListFileContext lfc;
  string commandName;
  string local_90;
  string local_70;
  cmOutputConverter converter;
  
  this_00 = &this->Snapshot;
  bVar2 = cmState::Snapshot::IsValid(this_00);
  if (bVar2) {
    cmState::Snapshot::GetCallStackParent(&parent,this_00);
    bVar2 = cmState::Snapshot::IsValid(&parent);
    if (bVar2) {
      cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&lfc.Name,&parent);
      sVar1 = lfc.Name._M_string_length;
      std::__cxx11::string::~string((string *)&lfc);
      if (sVar1 != 0) {
        cmOutputConverter::cmOutputConverter(&converter,*this_00);
        cmState::Snapshot::GetEntryPointCommand_abi_cxx11_(&commandName,this_00);
        lVar3 = cmState::Snapshot::GetEntryPointLine(this_00);
        std::operator<<(out,"Call Stack (most recent call first):\n");
        while( true ) {
          bVar2 = cmState::Snapshot::IsValid(&parent);
          if (!bVar2) break;
          lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
          lfc.Name._M_string_length = 0;
          lfc.Name.field_2._M_local_buf[0] = '\0';
          lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
          lfc.FilePath._M_string_length = 0;
          lfc.FilePath.field_2._M_local_buf[0] = '\0';
          lfc.Line = 0;
          std::__cxx11::string::_M_assign((string *)&lfc);
          lfc.Line = lVar3;
          cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_70,&parent);
          cmOutputConverter::Convert(&local_90,&converter,&local_70,HOME,UNCHANGED);
          std::__cxx11::string::operator=((string *)&lfc.FilePath,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          os = std::operator<<(out,"  ");
          operator<<(os,&lfc);
          std::operator<<(os,"\n");
          cmState::Snapshot::GetEntryPointCommand_abi_cxx11_(&local_90,&parent);
          std::__cxx11::string::operator=((string *)&commandName,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          lVar3 = cmState::Snapshot::GetEntryPointLine(&parent);
          cmState::Snapshot::GetCallStackParent((Snapshot *)&local_90,&parent);
          parent.Position.Position = local_90.field_2._M_allocated_capacity;
          parent.State = (cmState *)local_90._M_dataplus._M_p;
          parent.Position.Tree =
               (cmLinkedTree<cmState::SnapshotDataType> *)local_90._M_string_length;
          cmListFileContext::~cmListFileContext(&lfc);
        }
        std::__cxx11::string::~string((string *)&commandName);
      }
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintCallStack(std::ostream& out) const
{
  if (!this->Snapshot.IsValid())
    {
    return;
    }
  cmState::Snapshot parent = this->Snapshot.GetCallStackParent();
  if (!parent.IsValid() || parent.GetExecutionListFile().empty())
    {
    return;
    }

  cmOutputConverter converter(this->Snapshot);
  std::string commandName = this->Snapshot.GetEntryPointCommand();
  long commandLine = this->Snapshot.GetEntryPointLine();

  out << "Call Stack (most recent call first):\n";
  while(parent.IsValid())
    {
    cmListFileContext lfc;
    lfc.Name = commandName;
    lfc.Line = commandLine;

    lfc.FilePath = converter.Convert(parent.GetExecutionListFile(),
                                     cmOutputConverter::HOME);
    out << "  " << lfc << "\n";

    commandName = parent.GetEntryPointCommand();
    commandLine = parent.GetEntryPointLine();
    parent = parent.GetCallStackParent();
    }
}